

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function_simd.cpp
# Opt level: O2

uint32_t avx::Sum(uint32_t rowSize,uint8_t *imageY,uint8_t *imageYEnd,uint32_t simdWidth,
                 uint32_t totalSimdWidth,uint32_t nonSimdWidth)

{
  undefined1 (*pauVar1) [32];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  uint8_t *puVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  undefined1 auVar9 [64];
  undefined1 auVar10 [32];
  
  puVar5 = imageY + totalSimdWidth;
  auVar9 = ZEXT1664((undefined1  [16])0x0);
  iVar6 = 0;
  for (; imageY != imageYEnd; imageY = imageY + rowSize) {
    lVar7 = 0;
    while ((ulong)simdWidth << 5 != lVar7) {
      pauVar1 = (undefined1 (*) [32])(imageY + lVar7);
      lVar7 = lVar7 + 0x20;
      auVar10 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      auVar4 = vpunpcklbw_avx2(*pauVar1,auVar10);
      auVar3 = vpunpckhbw_avx2(*pauVar1,auVar10);
      auVar3 = vpaddw_avx2(auVar4,auVar3);
      auVar4 = vpunpcklwd_avx2(auVar3,auVar10);
      auVar3 = vpunpckhwd_avx2(auVar3,auVar10);
      auVar3 = vpaddd_avx2(auVar9._0_32_,auVar3);
      auVar3 = vpaddd_avx2(auVar3,auVar4);
      auVar9 = ZEXT3264(auVar3);
    }
    if (nonSimdWidth != 0) {
      for (uVar8 = 0; nonSimdWidth != uVar8; uVar8 = uVar8 + 1) {
        iVar6 = iVar6 + (uint)puVar5[uVar8];
      }
    }
    puVar5 = puVar5 + rowSize;
  }
  auVar2 = vphaddd_avx(auVar9._16_16_,auVar9._0_16_);
  auVar2 = vphaddd_avx(auVar2,auVar2);
  auVar2 = vphaddd_avx(auVar2,auVar2);
  return auVar2._0_4_ + iVar6;
}

Assistant:

uint32_t Sum( uint32_t rowSize, const uint8_t * imageY,const uint8_t * imageYEnd, uint32_t simdWidth, uint32_t totalSimdWidth, uint32_t nonSimdWidth )
    {
        uint32_t sum = 0;
        simd simdSum = _mm256_setzero_si256();
        simd zero    = _mm256_setzero_si256();

        for( ; imageY != imageYEnd; imageY += rowSize ) {
            const simd * src    = reinterpret_cast <const simd*> (imageY);
            const simd * srcEnd = src + simdWidth;

            for( ; src != srcEnd; ++src ) {
                simd data = _mm256_loadu_si256( src );

                simd dataLo  = _mm256_unpacklo_epi8( data, zero );
                simd dataHi  = _mm256_unpackhi_epi8( data, zero );
                simd sumLoHi = _mm256_add_epi16( dataLo, dataHi );

                simdSum = _mm256_add_epi32( simdSum, _mm256_add_epi32( _mm256_unpacklo_epi16( sumLoHi, zero ),
                                                                       _mm256_unpackhi_epi16( sumLoHi, zero ) ) );
            }

            if( nonSimdWidth > 0 ) {
                const uint8_t * imageX    = imageY + totalSimdWidth;
                const uint8_t * imageXEnd = imageX + nonSimdWidth;

                for( ; imageX != imageXEnd; ++imageX )
                    sum += (*imageX);
            }
        }

        uint32_t output[8] ={ 0 };

        _mm256_storeu_si256( reinterpret_cast <simd*>(output), simdSum );

        return sum + output[0] + output[1] + output[2] + output[3] + output[4] + output[5] + output[6] + output[7];
    }